

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tufted_laplacian.cpp
# Opt level: O2

void geometrycentral::surface::buildIntrinsicTuftedCover
               (SurfaceMesh *mesh,EdgeData<double> *edgeLengths,EmbeddedGeometryInterface *posGeom)

{
  Vector3 *pVVar1;
  undefined1 auVar2 [16];
  Vector3 *pVVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  pointer __first;
  pointer __last;
  ParentMeshT *pPVar6;
  size_t sVar7;
  ParentMeshT *pPVar8;
  uint uVar9;
  ParentMeshT *pPVar10;
  uint uVar11;
  size_t i_1;
  unsigned_long uVar12;
  ulong uVar13;
  ParentMeshT *pPVar14;
  pointer puVar15;
  unsigned_long uVar16;
  size_t sVar17;
  size_t i_5;
  size_t sVar18;
  ParentMeshT *pPVar19;
  ulong uVar20;
  size_t i;
  long lVar21;
  __normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
  __last_00;
  ulong uVar22;
  size_t i_2;
  size_t i_3;
  Halfedge heA;
  Face FVar23;
  Edge EVar24;
  Halfedge heB;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  edgeFaces;
  EmbeddedGeometryInterface *posGeom_local;
  Halfedge he;
  anon_class_24_3_ca2f44c0 edgeAngle;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __begin2_1;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  undefined1 local_118 [16];
  double local_108;
  EdgeData<bool> isOrigEdge;
  HalfedgeData<Halfedge> otherSheet;
  FaceData<bool> isFront;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __end2_1;
  
  posGeom_local = posGeom;
  if (posGeom != (EmbeddedGeometryInterface *)0x0) {
    EmbeddedGeometryInterface::requireVertexPositions(posGeom);
    EmbeddedGeometryInterface::requireFaceNormals(posGeom);
  }
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>::MeshData
            (&otherSheet,mesh);
  MeshData<geometrycentral::surface::Face,_bool>::MeshData(&isFront,mesh,true);
  isOrigEdge.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (bool *)mesh->nFacesFillCount;
  isOrigEdge.defaultValue = false;
  isOrigEdge._9_7_ = 0;
  isOrigEdge.mesh = mesh;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin
            (&__begin2,(RangeSetBase<geometrycentral::surface::FaceRangeF> *)&isOrigEdge);
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end
            (&__end2,(RangeSetBase<geometrycentral::surface::FaceRangeF> *)&isOrigEdge);
  while (sVar7 = __begin2.iCurr, pPVar6 = __begin2.mesh, __begin2.iCurr != __end2.iCurr) {
    if (isFront.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [__begin2.iCurr] == true) {
      FVar23.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
      ind = __begin2.iCurr;
      FVar23.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
      mesh = __begin2.mesh;
      FVar23 = SurfaceMesh::duplicateFace(mesh,FVar23);
      pPVar10 = FVar23.
                super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                .mesh;
      puVar15 = (pPVar10->fHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start +
                FVar23.
                super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                .ind;
      uVar12 = (pPVar6->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[sVar7];
      do {
        uVar16 = *puVar15;
        otherSheet.data.
        super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>.
        m_storage.m_data[uVar12].
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = pPVar10;
        otherSheet.data.
        super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>.
        m_storage.m_data[uVar12].
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
             = uVar16;
        otherSheet.data.
        super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>.
        m_storage.m_data[uVar16].
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = pPVar6;
        otherSheet.data.
        super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>.
        m_storage.m_data[uVar16].
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
             = uVar12;
        puVar15 = (pPVar10->heNextArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar16;
        uVar12 = (pPVar6->heNextArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12];
      } while (uVar12 != (pPVar6->fHalfedgeArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[sVar7]);
      SurfaceMesh::invertOrientation(mesh,FVar23);
      isFront.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [FVar23.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
       ind] = false;
    }
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++(&__begin2);
  }
  MeshData<geometrycentral::surface::Edge,_bool>::MeshData(&isOrigEdge,mesh,true);
  __end2.iEnd = mesh->nEdgesFillCount;
  __end2.iCurr = 0;
  __end2.mesh = mesh;
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::begin
            (&__begin2_1,(RangeSetBase<geometrycentral::surface::EdgeRangeF> *)&__end2);
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::end
            (&__end2_1,(RangeSetBase<geometrycentral::surface::EdgeRangeF> *)&__end2);
  while (sVar7 = __begin2_1.iCurr, pPVar8 = __begin2_1.mesh, __begin2_1.iCurr != __end2_1.iCurr) {
    if (isOrigEdge.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[__begin2_1.iCurr] == true) {
      edgeFaces.
      super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      edgeFaces.
      super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      edgeFaces.
      super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((__begin2_1.mesh)->useImplicitTwinFlag == true) {
        sVar17 = __begin2_1.iCurr * 2;
      }
      else {
        sVar17 = ((__begin2_1.mesh)->eHalfedgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[__begin2_1.iCurr];
      }
      __begin2.mesh = __begin2_1.mesh;
      __begin2.iEnd._0_1_ = '\x01';
      __begin2.iCurr = sVar17;
      while (((char)__begin2.iEnd != '\0' || (__begin2.iCurr != sVar17))) {
        he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = __begin2.mesh;
        he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        ind = __begin2.iCurr;
        if (isFront.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.
            m_data[((__begin2.mesh)->heFaceArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[__begin2.iCurr]] == true) {
          ::std::
          vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
          ::push_back(&edgeFaces,&he);
        }
        NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>::operator++
                  ((NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>
                    *)&__begin2);
      }
      if (posGeom_local != (EmbeddedGeometryInterface *)0x0) {
        if (pPVar8->useImplicitTwinFlag == true) {
          uVar12 = sVar7 * 2;
        }
        else {
          uVar12 = (pPVar8->eHalfedgeArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar7];
        }
        puVar15 = (pPVar8->heVertexArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pVVar3 = (posGeom_local->vertexPositions).data.
                 super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector3,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        uVar12 = puVar15[uVar12];
        pVVar1 = pVVar3 + uVar12;
        he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = (ParentMeshT *)pVVar1->x;
        he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        ind = (size_t)pVVar1->y;
        auVar5._0_8_ = pVVar1->x;
        auVar5._8_8_ = pVVar1->y;
        if (pPVar8->useImplicitTwinFlag == false) {
          uVar16 = (pPVar8->eHalfedgeArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar7];
        }
        else {
          uVar16 = sVar7 * 2;
        }
        uVar16 = puVar15[(pPVar8->heNextArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar16]];
        auVar2._0_8_ = pVVar3[uVar16].x;
        auVar2._8_8_ = pVVar3[uVar16].y;
        local_118 = vsubpd_avx(auVar2,auVar5);
        local_108 = pVVar3[uVar16].z - pVVar3[uVar12].z;
        Vector3::buildTangentBasis
                  ((array<geometrycentral::Vector3,_2UL> *)&__begin2,(Vector3 *)local_118);
        __last = edgeFaces.
                 super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        __first = edgeFaces.
                  super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        edgeAngle.posGeom = &posGeom_local;
        edgeAngle.pTail = (Vector3 *)&he;
        edgeAngle.eBasis = (array<geometrycentral::Vector3,_2UL> *)&__begin2;
        if (edgeFaces.
            super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            edgeFaces.
            super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          lVar21 = (long)edgeFaces.
                         super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)edgeFaces.
                         super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          ::std::
          __introsort_loop<__gnu_cxx::__normal_iterator<geometrycentral::surface::Halfedge*,std::vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<geometrycentral::surface::buildIntrinsicTuftedCover(geometrycentral::surface::SurfaceMesh&,geometrycentral::MeshData<geometrycentral::surface::Edge,double>&,geometrycentral::surface::EmbeddedGeometryInterface*)::__1>>
                    ((__normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
                      )edgeFaces.
                       super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
                      )edgeFaces.
                       super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                     (ulong)(uint)((int)LZCOUNT(lVar21 >> 4) * 2) ^ 0x7e,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_nmwsharp[P]nonmanifold_laplacian_deps_geometry_central_src_surface_tufted_laplacian_cpp:98:23)>
                      )&edgeAngle);
          if (lVar21 < 0x101) {
            ::std::
            __insertion_sort<__gnu_cxx::__normal_iterator<geometrycentral::surface::Halfedge*,std::vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>>,__gnu_cxx::__ops::_Iter_comp_iter<geometrycentral::surface::buildIntrinsicTuftedCover(geometrycentral::surface::SurfaceMesh&,geometrycentral::MeshData<geometrycentral::surface::Edge,double>&,geometrycentral::surface::EmbeddedGeometryInterface*)::__1>>
                      ((__normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
                        )__first,
                       (__normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
                        )__last,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_nmwsharp[P]nonmanifold_laplacian_deps_geometry_central_src_surface_tufted_laplacian_cpp:98:23)>
                                 )&edgeAngle);
          }
          else {
            __last_00._M_current = __first + 0x10;
            ::std::
            __insertion_sort<__gnu_cxx::__normal_iterator<geometrycentral::surface::Halfedge*,std::vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>>,__gnu_cxx::__ops::_Iter_comp_iter<geometrycentral::surface::buildIntrinsicTuftedCover(geometrycentral::surface::SurfaceMesh&,geometrycentral::MeshData<geometrycentral::surface::Edge,double>&,geometrycentral::surface::EmbeddedGeometryInterface*)::__1>>
                      ((__normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
                        )__first,__last_00,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_nmwsharp[P]nonmanifold_laplacian_deps_geometry_central_src_surface_tufted_laplacian_cpp:98:23)>
                        )&edgeAngle);
            for (; __last_00._M_current != __last; __last_00._M_current = __last_00._M_current + 1)
            {
              ::std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<geometrycentral::surface::Halfedge*,std::vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>>,__gnu_cxx::__ops::_Val_comp_iter<geometrycentral::surface::buildIntrinsicTuftedCover(geometrycentral::surface::SurfaceMesh&,geometrycentral::MeshData<geometrycentral::surface::Edge,double>&,geometrycentral::surface::EmbeddedGeometryInterface*)::__1>>
                        (__last_00,
                         (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_nmwsharp[P]nonmanifold_laplacian_deps_geometry_central_src_surface_tufted_laplacian_cpp:98:23)>
                          )&edgeAngle);
            }
          }
        }
      }
      pPVar19 = ((edgeFaces.
                  super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                ).mesh;
      sVar17 = ((edgeFaces.
                 super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               ).ind;
      if (pPVar19->useImplicitTwinFlag == true) {
        uVar11 = ~(uint)sVar17 & 1;
      }
      else {
        uVar11 = (uint)(pPVar19->heOrientArr).super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_start[sVar17];
      }
      if (uVar11 != 0) {
        pPVar19 = otherSheet.data.
                  super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                  .m_storage.m_data[sVar17].
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .mesh;
        sVar17 = otherSheet.data.
                 super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                 .m_storage.m_data[sVar17].
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .ind;
      }
      for (uVar22 = 1;
          uVar13 = (long)edgeFaces.
                         super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)edgeFaces.
                         super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4, uVar22 - 1 < uVar13;
          uVar22 = uVar22 + 1) {
        uVar20 = uVar22;
        if (uVar22 == uVar13) {
          uVar20 = 0;
        }
        if (pPVar19->useImplicitTwinFlag == true) {
          uVar11 = ~(uint)sVar17 & 1;
        }
        else {
          uVar11 = (uint)(pPVar19->heOrientArr).super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_start[sVar17];
        }
        pPVar14 = edgeFaces.
                  super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar20].
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .mesh;
        sVar18 = edgeFaces.
                 super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar20].
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .ind;
        if (pPVar14->useImplicitTwinFlag == true) {
          uVar9 = ~(uint)sVar18 & 1;
        }
        else {
          uVar9 = (uint)(pPVar14->heOrientArr).super__Vector_base<char,_std::allocator<char>_>.
                        _M_impl.super__Vector_impl_data._M_start[sVar18];
        }
        if ((uVar9 != 0) == (uVar11 != 0)) {
          pPVar14 = otherSheet.data.
                    super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                    .m_storage.m_data[sVar18].
                    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                    .mesh;
          sVar18 = otherSheet.data.
                   super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data[sVar18].
                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   .ind;
        }
        heA.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
        .ind = sVar17;
        heA.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
        .mesh = pPVar19;
        heB.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
        .ind = sVar18;
        heB.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
        .mesh = pPVar14;
        EVar24 = SurfaceMesh::separateToNewEdge(mesh,heA,heB);
        isOrigEdge.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[EVar24.
               super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
               ind] = false;
        pdVar4 = (edgeLengths->data).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        pdVar4[EVar24.
               super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
               ind] = pdVar4[sVar7];
        pPVar19 = otherSheet.data.
                  super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                  .m_storage.m_data[sVar18].
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .mesh;
        sVar17 = otherSheet.data.
                 super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                 .m_storage.m_data[sVar18].
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .ind;
      }
      ::std::
      _Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
      ::~_Vector_base(&edgeFaces.
                       super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                     );
    }
    RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator++(&__begin2_1);
  }
  MeshData<geometrycentral::surface::Edge,_bool>::~MeshData(&isOrigEdge);
  MeshData<geometrycentral::surface::Face,_bool>::~MeshData(&isFront);
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>::~MeshData
            (&otherSheet);
  return;
}

Assistant:

void buildIntrinsicTuftedCover(SurfaceMesh& mesh, EdgeData<double>& edgeLengths, EmbeddedGeometryInterface* posGeom) {

  if (posGeom) {
    posGeom->requireVertexPositions();
    posGeom->requireFaceNormals();
  }

  // == Transform the connectivity of the input in to that of the tufted cover

  // Create two copies of each input face
  HalfedgeData<Halfedge> otherSheet(mesh);
  FaceData<bool> isFront(mesh, true); // original copy serves as front
  for (Face fFront : mesh.faces()) {
    if (!isFront[fFront]) continue; // only process original faces

    // create the new face, orient it in the opposite direction
    Face fBack = mesh.duplicateFace(fFront);

    // read off the correspondence bewteen the halfedges, before inverting
    Halfedge heF = fFront.halfedge();
    Halfedge heB = fBack.halfedge();
    do {
      otherSheet[heF] = heB;
      otherSheet[heB] = heF;
      heF = heF.next();
      heB = heB.next();
    } while (heF != fFront.halfedge());

    mesh.invertOrientation(fBack);

    isFront[fBack] = false;
  }


  // Around each edge, glue back faces to front along newly created edges
  EdgeData<bool> isOrigEdge(mesh, true);
  for (Edge e : mesh.edges()) {
    if (!isOrigEdge[e]) continue;

    // Gather the original faces incident on the edge (represented by the halfedge along the edge)
    std::vector<Halfedge> edgeFaces;
    for (Halfedge he : e.adjacentHalfedges()) {
      if (isFront[he.face()]) edgeFaces.push_back(he);
    }

    // If we have normals, use them for an angular sort.
    // Otherwise, just use the "natural" (arbitrary) ordering
    if (posGeom) {

      Vector3 pTail = posGeom->vertexPositions[e.halfedge().tailVertex()];
      Vector3 pTip = posGeom->vertexPositions[e.halfedge().tipVertex()];
      Vector3 edgeVec = pTip - pTail;
      std::array<Vector3, 2> eBasis = edgeVec.buildTangentBasis();

      auto edgeAngle = [&](const Halfedge& he) {
        Vector3 oppVert = posGeom->vertexPositions[he.next().tipVertex()];
        Vector3 outVec = unit(oppVert - pTail);
        return ::std::atan2(dot(std::get<1>(eBasis), outVec), dot(std::get<0>(eBasis), outVec));
      };
      auto sortFunc = [&](const Halfedge& heA, const Halfedge& heB) -> bool { return edgeAngle(heA) > edgeAngle(heB); };

      std::sort(edgeFaces.begin(), edgeFaces.end(), sortFunc);
    }


    // Sequentially connect the faces
    Halfedge currHe = edgeFaces.front();
    if (currHe.orientation()) currHe = otherSheet[currHe];
    for (size_t i = 0; i < edgeFaces.size(); i++) {
      Halfedge nextHe = edgeFaces[(i + 1) % edgeFaces.size()];
      if (currHe.orientation() == nextHe.orientation()) nextHe = otherSheet[nextHe];
      Edge newE = mesh.separateToNewEdge(currHe, nextHe);
      isOrigEdge[newE] = false;
      edgeLengths[newE] = edgeLengths[e];
      currHe = otherSheet[nextHe];
    }
  }

  // sanity checks
  // if (mesh.hasBoundary()) throw std::runtime_error("has boundary");
  // if (!mesh.isEdgeManifold()) throw std::runtime_error("not edge manifold");
  // if (!mesh.isOriented()) throw std::runtime_error("not oriented");
}